

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  FILE *pFVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  char *pcVar6;
  size_t extraout_RDX;
  ulong uVar7;
  StringRef path;
  StringRef path_00;
  StringRef SVar8;
  StringRef name;
  StringRef name_00;
  StringRef in_stack_ffffffffffffff28;
  string command;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  string local_50;
  
  pcVar6 = *argv;
  if (pcVar6 == (char *)0x0) {
    sVar4 = 0;
  }
  else {
    sVar4 = strlen(pcVar6);
  }
  sVar5 = 0;
  SVar8.Length = sVar4;
  SVar8.Data = pcVar6;
  llvm::sys::PrintStackTraceOnErrorSignal(SVar8,false);
  pcVar6 = *argv;
  if (pcVar6 != (char *)0x0) {
    sVar5 = strlen(pcVar6);
  }
  path.Length = sVar5;
  path.Data = pcVar6;
  SVar8 = llvm::sys::path::filename(path,native);
  if ((SVar8.Length == 5) && (iVar3 = bcmp(SVar8.Data,"ninja",5), iVar3 == 0)) {
    name_00.Length = extraout_RDX;
    name_00.Data = (char *)0x7;
    llbuild::commands::setProgramName((commands *)0x1aab49,name_00);
    args_1.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    args_1.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    args_1.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string((string *)&command,"build",(allocator *)&args);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&args_1,&command
              );
    std::__cxx11::string::_M_dispose();
    for (uVar7 = 1; (uint)argc != uVar7; uVar7 = uVar7 + 1) {
      std::__cxx11::string::string((string *)&command,argv[uVar7],(allocator *)&args);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&args_1,
                 &command);
      std::__cxx11::string::_M_dispose();
    }
    iVar3 = llbuild::commands::executeNinjaCommand(&args_1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&args_1);
    return iVar3;
  }
  pcVar6 = *argv;
  if (pcVar6 == (char *)0x0) {
    sVar4 = 0;
  }
  else {
    sVar4 = strlen(pcVar6);
  }
  path_00.Length = sVar4;
  path_00.Data = pcVar6;
  SVar8 = llvm::sys::path::filename(path_00,native);
  name.Length = (char *)SVar8.Length;
  name.Data = name.Length;
  llbuild::commands::setProgramName((commands *)SVar8.Data,name);
  if (argc != 1) {
    std::__cxx11::string::string((string *)&command,argv[1],(allocator *)&args_1);
    bVar2 = std::operator==(&command,"--help");
    std::__cxx11::string::_M_dispose();
    if (!bVar2) {
      std::__cxx11::string::string((string *)&command,argv[1],(allocator *)&args_1);
      bVar2 = std::operator==(&command,"--version");
      std::__cxx11::string::_M_dispose();
      if (!bVar2) {
        std::__cxx11::string::string((string *)&command,argv[1],(allocator *)&args_1);
        args.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        args.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        args.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        for (uVar7 = 2; (uint)argc != uVar7; uVar7 = uVar7 + 1) {
          std::__cxx11::string::string
                    ((string *)&args_1,argv[uVar7],(allocator *)&stack0xffffffffffffff37);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&args,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&args_1);
          std::__cxx11::string::_M_dispose();
        }
        bVar2 = std::operator==(&command,"ninja");
        if (bVar2) {
          iVar3 = llbuild::commands::executeNinjaCommand(&args);
        }
        else {
          bVar2 = std::operator==(&command,"buildengine");
          if (bVar2) {
            iVar3 = llbuild::commands::executeBuildEngineCommand(&args);
          }
          else {
            bVar2 = std::operator==(&command,"buildsystem");
            if (bVar2) {
              iVar3 = llbuild::commands::executeBuildSystemCommand(&args);
            }
            else {
              bVar2 = std::operator==(&command,"analyze");
              pFVar1 = _stderr;
              if (bVar2) {
                std::__cxx11::string::string
                          ((string *)&local_50,"llbuild-analyze",(allocator *)&args_1);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector(&local_68,&args);
                iVar3 = executeExternalCommand(&local_50,&local_68);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_68);
                std::__cxx11::string::_M_dispose();
              }
              else {
                pcVar6 = llbuild::commands::getProgramName();
                fprintf(pFVar1,"error: %s: unknown command \'%s\'\n",pcVar6,command._M_dataplus._M_p
                       );
                iVar3 = 1;
              }
            }
          }
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&args);
        std::__cxx11::string::_M_dispose();
        return iVar3;
      }
      llbuild::getLLBuildFullVersion_abi_cxx11_(in_stack_ffffffffffffff28);
      puts(command._M_dataplus._M_p);
      std::__cxx11::string::_M_dispose();
      return 0;
    }
  }
  pFVar1 = _stderr;
  pcVar6 = llbuild::commands::getProgramName();
  fprintf(pFVar1,"Usage: %s [--version] [--help] <command> [<args>]\n",pcVar6);
  fputc(10,_stderr);
  fwrite("Available commands:\n",0x14,1,_stderr);
  fwrite("  ninja       -- Run the Ninja subtool\n",0x27,1,_stderr);
  fwrite("  buildengine -- Run the build engine subtool\n",0x2e,1,_stderr);
  fwrite("  buildsystem -- Run the build system subtool\n",0x2e,1,_stderr);
  fwrite("  analyze     -- Run the analyze subtool\n",0x29,1,_stderr);
  fputc(10,_stderr);
  exit(0);
}

Assistant:

int main(int argc, const char **argv) {
  // Print stacks on error.
  llvm::sys::PrintStackTraceOnErrorSignal(argv[0]);
  
  // Support use of llbuild as a replacement for ninja by indirecting to the
  // `ninja build` subtool when invoked under the name `ninja.
  if (llvm::sys::path::filename(argv[0]) == "ninja") {
    // We still want to represent ourselves as llbuild in output messages.
    setProgramName("llbuild");

    std::vector<std::string> args;
    args.push_back("build");
    for (int i = 1; i != argc; ++i) {
      args.push_back(argv[i]);
    }
    return executeNinjaCommand(args);
  } else {
    setProgramName(llvm::sys::path::filename(argv[0]));
  }

  // Expect the first argument to be the name of a subtool to delegate to.
  if (argc == 1 || std::string(argv[1]) == "--help")
    usage();

  if (std::string(argv[1]) == "--version") {
    // Print the version and exit.
    printf("%s\n", getLLBuildFullVersion().c_str());
    return 0;
  }

  // Otherwise, expect a command name.
  std::string command(argv[1]);
  std::vector<std::string> args;
  for (int i = 2; i != argc; ++i) {
    args.push_back(argv[i]);
  }

  if (command == "ninja") {
    return executeNinjaCommand(args);
  } else if (command == "buildengine") {
    return executeBuildEngineCommand(args);
  } else if (command == "buildsystem") {
    return executeBuildSystemCommand(args);
  } else if (command == "analyze") {
    // Next to the llbuild binary we build a llbuild-analyze binary with SwiftPM
    // which we treat as a subtool to llbuild. If that doesn't exist, the exec
    // will fail.
    return executeExternalCommand("llbuild-analyze", args);
  } else {
    fprintf(stderr, "error: %s: unknown command '%s'\n", getProgramName(),
            command.c_str());
    return 1;
  }
}